

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O2

REF_STATUS ref_matrix_qr(REF_INT m,REF_INT n,REF_DBL *a,REF_DBL *q,REF_DBL *r)

{
  double dVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  REF_DBL *pRVar6;
  long lVar7;
  REF_DBL *pRVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  REF_DBL *pRVar12;
  ulong uVar13;
  long lVar14;
  REF_DBL RVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  uVar4 = 0;
  uVar13 = 0;
  if (0 < m) {
    uVar13 = (ulong)(uint)m;
  }
  uVar5 = 0;
  if (0 < n) {
    uVar5 = (ulong)(uint)n;
  }
  lVar10 = (long)m;
  pRVar6 = q;
  pRVar8 = a;
  for (; uVar4 != uVar5; uVar4 = uVar4 + 1) {
    for (uVar9 = 0; uVar13 != uVar9; uVar9 = uVar9 + 1) {
      pRVar6[uVar9] = pRVar8[uVar9];
    }
    pRVar8 = pRVar8 + lVar10;
    pRVar6 = pRVar6 + lVar10;
  }
  lVar7 = (long)n;
  pRVar6 = r;
  for (uVar4 = 0; uVar4 != uVar5; uVar4 = uVar4 + 1) {
    for (uVar9 = 0; (uint)n != uVar9; uVar9 = uVar9 + 1) {
      pRVar6[uVar9] = 0.0;
    }
    pRVar6 = pRVar6 + lVar7;
  }
  iVar3 = 1;
  uVar4 = 0;
  pRVar6 = q;
  do {
    if (uVar4 == uVar5) {
      return 0;
    }
    lVar14 = (long)iVar3;
    lVar11 = lVar10 * 8 * lVar14;
    pRVar8 = (REF_DBL *)((long)q + lVar11);
    pRVar12 = (REF_DBL *)(lVar11 + (long)a);
    iVar2 = (n + 1) * (int)uVar4;
    for (uVar9 = 0; uVar13 != uVar9; uVar9 = uVar9 + 1) {
      r[iVar2] = pRVar6[uVar9] * pRVar6[uVar9] + r[iVar2];
    }
    dVar1 = r[iVar2];
    if (dVar1 < 0.0) {
      RVar15 = sqrt(dVar1);
    }
    else {
      RVar15 = SQRT(dVar1);
    }
    r[iVar2] = RVar15;
    for (uVar9 = 0; uVar13 != uVar9; uVar9 = uVar9 + 1) {
      auVar16._0_8_ = r[iVar2] * 1e+20;
      dVar1 = pRVar6[uVar9];
      auVar16._8_8_ = dVar1;
      auVar17._8_8_ = -dVar1;
      auVar17._0_8_ = -auVar16._0_8_;
      auVar17 = maxpd(auVar16,auVar17);
      if (auVar17._0_8_ <= auVar17._8_8_) {
        return 4;
      }
      pRVar6[uVar9] = dVar1 / r[iVar2];
    }
    for (; lVar14 < lVar7; lVar14 = lVar14 + 1) {
      lVar11 = lVar14 * lVar7;
      for (uVar9 = 0; uVar13 != uVar9; uVar9 = uVar9 + 1) {
        r[uVar4 + lVar11] = pRVar12[uVar9] * pRVar6[uVar9] + r[uVar4 + lVar11];
      }
      for (uVar9 = 0; uVar13 != uVar9; uVar9 = uVar9 + 1) {
        pRVar8[uVar9] = pRVar8[uVar9] - r[uVar4 + lVar11] * pRVar6[uVar9];
      }
      pRVar12 = pRVar12 + lVar10;
      pRVar8 = pRVar8 + lVar10;
    }
    uVar4 = uVar4 + 1;
    iVar3 = iVar3 + 1;
    pRVar6 = pRVar6 + lVar10;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_matrix_qr(REF_INT m, REF_INT n, REF_DBL *a, REF_DBL *q,
                                 REF_DBL *r) {
  REF_INT i, j, k;

  for (j = 0; j < n; j++)
    for (i = 0; i < m; i++) q[i + m * j] = a[i + m * j];

  for (j = 0; j < n; j++)
    for (i = 0; i < n; i++) r[i + n * j] = 0.0;

  for (k = 0; k < n; k++) {
    for (i = 0; i < m; i++) r[k + n * k] += q[i + m * k] * q[i + m * k];
    r[k + n * k] = sqrt(r[k + n * k]);
    for (i = 0; i < m; i++) {
      if (!ref_math_divisible(q[i + m * k], r[k + n * k])) {
        return REF_DIV_ZERO;
      }
      q[i + m * k] /= r[k + n * k];
    }
    for (j = k + 1; j < n; j++) {
      for (i = 0; i < m; i++) r[k + n * j] += a[i + m * j] * q[i + m * k];
      for (i = 0; i < m; i++) q[i + m * j] -= r[k + n * j] * q[i + m * k];
    }
  }

  return REF_SUCCESS;
}